

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O0

int __thiscall
embree::ExtObjMaterial::select
          (ExtObjMaterial *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  void *pvVar14;
  Vec3fa *pVVar15;
  undefined4 in_register_00000034;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  bool bVar17;
  shared_ptr<embree::Texture> nulltex;
  shared_ptr<embree::Texture> *in_stack_fffffffffffff908;
  shared_ptr<embree::Texture> *in_stack_fffffffffffff910;
  Vec3fa *in_stack_fffffffffffff948;
  MirrorMaterial *in_stack_fffffffffffff950;
  Vec3fa *in_stack_fffffffffffff958;
  MetalMaterial *in_stack_fffffffffffff960;
  MetalMaterial *in_stack_fffffffffffff970;
  undefined8 in_stack_fffffffffffff978;
  Vec3fa *in_stack_fffffffffffff980;
  ThinDielectricMaterial *in_stack_fffffffffffff988;
  float fVar18;
  shared_ptr<embree::Texture> *in_stack_fffffffffffff990;
  undefined5 in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff99d;
  undefined1 in_stack_fffffffffffff99e;
  undefined1 in_stack_fffffffffffff99f;
  shared_ptr<embree::Texture> *in_stack_fffffffffffff9a0;
  Vec3fa *in_stack_fffffffffffff9a8;
  shared_ptr<embree::Texture> *in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  float fVar19;
  OBJMaterial *in_stack_fffffffffffff9c0;
  OBJMaterial *this_00;
  Vec3fa *in_stack_fffffffffffffa10;
  shared_ptr<embree::Texture> *in_stack_fffffffffffffa18;
  Vec3fa *in_stack_fffffffffffffa20;
  shared_ptr<embree::Texture> *in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  _Atomic_word _Var20;
  shared_ptr<embree::Texture> *in_stack_fffffffffffffa38;
  shared_ptr<embree::Texture> *map_Displ;
  undefined8 local_578;
  undefined8 uStack_570;
  _func_int **local_568;
  ulong uStack_560;
  undefined8 local_558;
  ulong uStack_550;
  _func_int **local_548;
  ulong uStack_540;
  undefined8 local_538;
  ulong uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  _func_int **local_518;
  ulong uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  ulong uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined1 local_4d1;
  undefined1 local_4d0 [304];
  shared_ptr<embree::Texture> local_3a0 [2];
  undefined1 local_380 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_370;
  ExtObjMaterial *local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_360;
  ExtObjMaterial *local_358;
  void *local_350;
  ExtObjMaterial *local_348;
  void *local_340;
  ExtObjMaterial *local_338;
  void *local_330;
  ExtObjMaterial *local_328;
  void *local_320;
  ExtObjMaterial *local_318;
  void *local_310;
  ExtObjMaterial *local_308;
  Vec3fa *local_300;
  ExtObjMaterial *local_2f8;
  Vec3fa *local_2f0;
  ExtObjMaterial *local_2e8;
  void *local_2e0;
  ExtObjMaterial *local_2d8;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c0;
  _func_int ***local_2b8;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a0;
  _func_int ***local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_280;
  _func_int ***local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  undefined4 local_254;
  undefined8 *local_250;
  undefined4 local_244;
  undefined8 *local_240;
  undefined4 local_234;
  undefined8 *local_230;
  undefined4 local_224;
  undefined8 *local_220;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 local_208;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 local_1e8;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 local_1c8;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 local_1a8;
  _func_int **local_198;
  ulong uStack_190;
  undefined4 local_188;
  undefined4 local_184;
  uint local_180;
  undefined4 local_17c;
  undefined8 local_178;
  ulong uStack_170;
  undefined4 local_168;
  _Atomic_word local_164;
  uint local_160;
  undefined4 local_15c;
  _func_int **local_158;
  ulong uStack_150;
  undefined4 local_148;
  undefined4 local_144;
  uint local_140;
  undefined4 local_13c;
  undefined8 local_138;
  ulong uStack_130;
  undefined4 local_128;
  _Atomic_word local_124;
  uint local_120;
  undefined4 local_11c;
  _func_int **local_118;
  ulong uStack_110;
  undefined4 local_108;
  undefined4 local_104;
  float local_100;
  undefined4 local_fc;
  undefined8 local_f8;
  ulong uStack_f0;
  undefined4 local_e8;
  _Atomic_word local_e4;
  float local_e0;
  undefined4 local_dc;
  undefined8 *local_d8;
  _func_int ***local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  undefined4 uStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  ulong uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  fVar19 = (float)((ulong)in_stack_fffffffffffff9b8 >> 0x20);
  p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_00000034,__nfds);
  local_370._M_pi = p_Var16;
  local_368 = this;
  std::shared_ptr<embree::Texture>::shared_ptr((shared_ptr<embree::Texture> *)0x36885e);
  if (*(int *)&p_Var16->_vptr__Sp_counted_base == 0) {
    p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              SceneGraph::MaterialNode::operator_new(0x368879);
    fVar18 = (float)((ulong)in_stack_fffffffffffff988 >> 0x20);
    local_4d0[0xcf] = 1;
    _Var20 = p_Var16->_M_use_count;
    map_Displ = local_3a0;
    std::shared_ptr<embree::Texture>::shared_ptr
              (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
    std::shared_ptr<embree::Texture>::shared_ptr
              (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
    std::shared_ptr<embree::Texture>::shared_ptr
              (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
    p_Var16 = p_Var16 + 4;
    pVVar15 = (Vec3fa *)(local_4d0 + 0x100);
    std::shared_ptr<embree::Texture>::shared_ptr
              (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
    std::shared_ptr<embree::Texture>::shared_ptr
              (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
    std::shared_ptr<embree::Texture>::shared_ptr
              (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
    std::shared_ptr<embree::Texture>::shared_ptr
              (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
    OBJMaterial::OBJMaterial
              (in_stack_fffffffffffff9c0,fVar19,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
               in_stack_fffffffffffff9a0,
               (Vec3fa *)
               CONCAT17(in_stack_fffffffffffff99f,
                        CONCAT16(in_stack_fffffffffffff99e,
                                 CONCAT15(in_stack_fffffffffffff99d,in_stack_fffffffffffff998))),
               in_stack_fffffffffffff990,in_stack_fffffffffffffa10,in_stack_fffffffffffffa18,pVVar15
               ,(shared_ptr<embree::Texture> *)p_Var16,fVar18,
               (shared_ptr<embree::Texture> *)CONCAT44(_Var20,in_stack_fffffffffffffa30),map_Displ);
    local_4d0[0xcf] = 0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this = p_Var13;
    lVar1._0_4_ = this->type;
    lVar1._4_4_ = this->illum;
    local_360._M_pi = p_Var13;
    local_358 = this;
    if (lVar1 != 0) {
      (**(code **)(**(long **)this + 0x10))();
    }
    std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x368aa2);
    std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x368aaf);
    std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x368abc);
    std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x368ac9);
    std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x368ad6);
    std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x368ae3);
    std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x368af0);
  }
  else if (*(int *)&p_Var16->_vptr__Sp_counted_base == 1) {
    if (((float)p_Var16[0xe]._M_use_count != 1.0) || (NAN((float)p_Var16[0xe]._M_use_count))) {
      pvVar14 = SceneGraph::MaterialNode::operator_new(0x368be5);
      local_270 = local_4d0 + 0xb8;
      local_38 = 0;
      uStack_30 = 0;
      local_4d0._184_8_ = 0;
      local_4d0._192_8_ = 0;
      MetallicPaintMaterial::MetallicPaintMaterial
                ((MetallicPaintMaterial *)in_stack_fffffffffffff960,in_stack_fffffffffffff958,
                 (Vec3fa *)in_stack_fffffffffffff950,
                 (float)((ulong)in_stack_fffffffffffff948 >> 0x20),
                 SUB84(in_stack_fffffffffffff948,0));
      *(void **)this = pvVar14;
      lVar2._0_4_ = this->type;
      lVar2._4_4_ = this->illum;
      local_350 = pvVar14;
      local_348 = this;
      if (lVar2 != 0) {
        (**(code **)(**(long **)this + 0x10))();
      }
    }
    else {
      pvVar14 = SceneGraph::MaterialNode::operator_new(0x368cfe);
      fVar18 = (float)((ulong)in_stack_fffffffffffff988 >> 0x20);
      local_4d1 = 1;
      std::shared_ptr<embree::Texture>::shared_ptr
                (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      local_268 = local_4d0 + 0x88;
      local_48 = 0;
      uStack_40 = 0;
      local_4d0._136_4_ = 0.0;
      local_4d0._140_4_ = 0.0;
      local_4d0._144_8_ = 0;
      std::shared_ptr<embree::Texture>::shared_ptr
                (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      std::shared_ptr<embree::Texture>::shared_ptr
                (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      std::shared_ptr<embree::Texture>::shared_ptr
                (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      local_260 = local_4d0 + 0x38;
      local_58 = 0;
      uStack_50 = 0;
      local_4d0._56_8_ = 0;
      local_4d0._64_8_ = 0;
      fVar19 = (float)((ulong)local_380 >> 0x20);
      std::shared_ptr<embree::Texture>::shared_ptr
                (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      std::shared_ptr<embree::Texture>::shared_ptr
                (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      this_00 = (OBJMaterial *)local_4d0;
      std::shared_ptr<embree::Texture>::shared_ptr
                (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      OBJMaterial::OBJMaterial
                (this_00,fVar19,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
                 in_stack_fffffffffffff9a0,
                 (Vec3fa *)
                 CONCAT17(in_stack_fffffffffffff99f,
                          CONCAT16(in_stack_fffffffffffff99e,
                                   CONCAT15(in_stack_fffffffffffff99d,in_stack_fffffffffffff998))),
                 in_stack_fffffffffffff990,in_stack_fffffffffffffa10,in_stack_fffffffffffffa18,
                 in_stack_fffffffffffffa20,in_stack_fffffffffffffa28,fVar18,
                 (shared_ptr<embree::Texture> *)
                 CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                 in_stack_fffffffffffffa38);
      local_4d1 = 0;
      *(void **)this = pvVar14;
      lVar3._0_4_ = this->type;
      lVar3._4_4_ = this->illum;
      local_340 = pvVar14;
      local_338 = this;
      if (lVar3 != 0) {
        (**(code **)(**(long **)this + 0x10))();
      }
      std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x368f8b);
      std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x368f98);
      std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x368fa5);
      std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x368fb2);
      std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x368fbf);
      std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x368fcc);
      std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x368fd9);
    }
  }
  else if (*(int *)&p_Var16->_vptr__Sp_counted_base == 2) {
    pvVar14 = SceneGraph::MaterialNode::operator_new(0x369091);
    local_250 = &local_4e8;
    local_254 = 0x3f800000;
    local_1a8 = 0x3f800000;
    local_1b8 = 0x3f800000;
    uStack_1b4 = 0x3f800000;
    uStack_1b0 = 0x3f800000;
    uStack_1ac = 0x3f800000;
    local_4e8 = 0x3f8000003f800000;
    uStack_4e0 = 0x3f8000003f800000;
    ThinDielectricMaterial::ThinDielectricMaterial
              (in_stack_fffffffffffff988,in_stack_fffffffffffff980,
               (float)((ulong)in_stack_fffffffffffff978 >> 0x20),(float)in_stack_fffffffffffff978);
    *(void **)this = pvVar14;
    lVar4._0_4_ = this->type;
    lVar4._4_4_ = this->illum;
    local_330 = pvVar14;
    local_328 = this;
    if (lVar4 != 0) {
      (**(code **)(**(long **)this + 0x10))();
    }
  }
  else if (*(int *)&p_Var16->_vptr__Sp_counted_base == 3) {
    if ((*(float *)&p_Var16[0xd]._vptr__Sp_counted_base != 0.0) ||
       (NAN(*(float *)&p_Var16[0xd]._vptr__Sp_counted_base))) {
      pVVar15 = (Vec3fa *)SceneGraph::MaterialNode::operator_new(0x3697f7);
      local_290 = (undefined8 *)((long)&p_Var16[0x10]._vptr__Sp_counted_base + 4);
      local_288 = &local_558;
      local_160 = p_Var16[0x10]._M_weak_count;
      local_168 = *(undefined4 *)local_290;
      local_164 = p_Var16[0x10]._M_use_count;
      local_178 = *local_290;
      local_15c = 0;
      uStack_170 = (ulong)local_160;
      local_280 = p_Var16 + 0x11;
      local_278 = &local_568;
      local_180 = p_Var16[0x11]._M_use_count;
      local_188 = *(undefined4 *)&local_280->_vptr__Sp_counted_base;
      local_184 = *(undefined4 *)((long)&p_Var16[0x11]._vptr__Sp_counted_base + 4);
      local_198 = local_280->_vptr__Sp_counted_base;
      local_17c = 0;
      uStack_190 = (ulong)local_180;
      local_568 = local_198;
      uStack_560 = uStack_190;
      local_558 = local_178;
      uStack_550 = uStack_170;
      MetalMaterial::MetalMaterial
                (in_stack_fffffffffffff970,pVVar15,(Vec3fa *)(p_Var16 + 3),in_stack_fffffffffffff958
                 ,(float)((ulong)in_stack_fffffffffffff950 >> 0x20));
      *(Vec3fa **)this = pVVar15;
      lVar7._0_4_ = this->type;
      lVar7._4_4_ = this->illum;
      local_300 = pVVar15;
      local_2f8 = this;
      if (lVar7 != 0) {
        (**(code **)(**(long **)this + 0x10))();
      }
    }
    else {
      local_2d0 = (undefined8 *)((long)&p_Var16[0x10]._vptr__Sp_counted_base + 4);
      local_2c8 = &local_4f8;
      local_e0 = (float)p_Var16[0x10]._M_weak_count;
      local_e8 = *(undefined4 *)local_2d0;
      local_e4 = p_Var16[0x10]._M_use_count;
      local_f8 = *local_2d0;
      local_dc = 0;
      uStack_f0 = (ulong)(uint)local_e0;
      local_240 = &local_508;
      local_244 = 0x3f800000;
      local_1c8 = 0x3f800000;
      local_1d8 = 0x3f800000;
      uStack_1d4 = 0x3f800000;
      uStack_1d0 = 0x3f800000;
      uStack_1cc = 0x3f800000;
      local_508 = 0x3f8000003f800000;
      uStack_500 = 0x3f8000003f800000;
      local_c0 = &local_4f8;
      local_c8 = &local_508;
      local_98 = 0x3f8000003f800000;
      uStack_90 = 0x3f8000003f800000;
      local_88._0_4_ = (float)local_f8;
      local_88._4_4_ = (float)((ulong)local_f8 >> 0x20);
      local_b8 = -(uint)((float)local_88 == 1.0);
      iStack_b4 = -(uint)(local_88._4_4_ == 1.0);
      iStack_b0 = -(uint)(local_e0 == 1.0);
      uStack_ac = 0;
      auVar10._4_4_ = iStack_b4;
      auVar10._0_4_ = local_b8;
      auVar10._8_4_ = iStack_b0;
      auVar10._12_4_ = 0;
      uVar12 = movmskps((int)local_c8,auVar10);
      bVar17 = false;
      if ((uVar12 & 7) == 7) {
        local_2c0 = p_Var16 + 0x11;
        local_2b8 = &local_518;
        local_100 = (float)p_Var16[0x11]._M_use_count;
        local_108 = *(undefined4 *)&local_2c0->_vptr__Sp_counted_base;
        local_104 = *(undefined4 *)((long)&p_Var16[0x11]._vptr__Sp_counted_base + 4);
        local_118 = local_2c0->_vptr__Sp_counted_base;
        local_fc = 0;
        uStack_110 = (ulong)(uint)local_100;
        local_230 = &local_528;
        local_234 = 0;
        local_1e8 = 0;
        local_1f8 = 0;
        uStack_1f4 = 0;
        uStack_1f0 = 0;
        uStack_1ec = 0;
        local_528 = 0;
        uStack_520 = 0;
        local_d0 = &local_518;
        local_d8 = &local_528;
        local_78 = 0;
        uStack_70 = 0;
        local_68._0_4_ = SUB84(local_118,0);
        local_68._4_4_ = (float)((ulong)local_118 >> 0x20);
        local_a8 = -(uint)((float)local_68 == 0.0);
        iStack_a4 = -(uint)(local_68._4_4_ == 0.0);
        iStack_a0 = -(uint)(local_100 == 0.0);
        uStack_9c = 0xffffffff;
        auVar11._4_4_ = iStack_a4;
        auVar11._0_4_ = local_a8;
        auVar11._8_4_ = iStack_a0;
        auVar11._12_4_ = 0xffffffff;
        uVar12 = movmskps((int)local_d8,auVar11);
        bVar17 = (uVar12 & 7) == 7;
        local_68 = local_118;
        uStack_60 = uStack_110;
        local_518 = local_118;
        uStack_510 = uStack_110;
      }
      local_88 = local_f8;
      uStack_80 = uStack_f0;
      local_4f8 = local_f8;
      uStack_4f0 = uStack_f0;
      if (bVar17) {
        pvVar14 = SceneGraph::MaterialNode::operator_new(0x36951e);
        MirrorMaterial::MirrorMaterial(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
        *(void **)this = pvVar14;
        lVar5._0_4_ = this->type;
        lVar5._4_4_ = this->illum;
        local_320 = pvVar14;
        local_318 = this;
        if (lVar5 != 0) {
          (**(code **)(**(long **)this + 0x10))();
        }
      }
      else {
        pvVar14 = SceneGraph::MaterialNode::operator_new(0x3695de);
        local_2b0 = (undefined8 *)((long)&p_Var16[0x10]._vptr__Sp_counted_base + 4);
        local_2a8 = &local_538;
        local_120 = p_Var16[0x10]._M_weak_count;
        local_128 = *(undefined4 *)local_2b0;
        local_124 = p_Var16[0x10]._M_use_count;
        local_138 = *local_2b0;
        local_11c = 0;
        uStack_130 = (ulong)local_120;
        local_2a0 = p_Var16 + 0x11;
        local_298 = &local_548;
        local_140 = p_Var16[0x11]._M_use_count;
        local_148 = *(undefined4 *)&local_2a0->_vptr__Sp_counted_base;
        local_144 = *(undefined4 *)((long)&p_Var16[0x11]._vptr__Sp_counted_base + 4);
        local_158 = local_2a0->_vptr__Sp_counted_base;
        local_13c = 0;
        uStack_150 = (ulong)local_140;
        local_548 = local_158;
        uStack_540 = uStack_150;
        local_538 = local_138;
        uStack_530 = uStack_130;
        MetalMaterial::MetalMaterial
                  (in_stack_fffffffffffff960,in_stack_fffffffffffff958,
                   (Vec3fa *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
        *(void **)this = pvVar14;
        lVar6._0_4_ = this->type;
        lVar6._4_4_ = this->illum;
        local_310 = pvVar14;
        local_308 = this;
        if (lVar6 != 0) {
          (**(code **)(**(long **)this + 0x10))();
        }
      }
    }
  }
  else if (*(int *)&p_Var16->_vptr__Sp_counted_base == 4) {
    pVVar15 = (Vec3fa *)SceneGraph::MaterialNode::operator_new(0x369a31);
    MetallicPaintMaterial::MetallicPaintMaterial
              ((MetallicPaintMaterial *)in_stack_fffffffffffff960,in_stack_fffffffffffff958,pVVar15,
               (float)((ulong)in_stack_fffffffffffff948 >> 0x20),SUB84(in_stack_fffffffffffff948,0))
    ;
    *(Vec3fa **)this = pVVar15;
    lVar8._0_4_ = this->type;
    lVar8._4_4_ = this->illum;
    local_2f0 = pVVar15;
    local_2e8 = this;
    if (lVar8 != 0) {
      (**(code **)(**(long **)this + 0x10))();
    }
  }
  else {
    pvVar14 = SceneGraph::MaterialNode::operator_new(0x369afc);
    local_220 = &local_578;
    local_224 = 0x3f000000;
    local_208 = 0x3f000000;
    local_218 = 0x3f000000;
    uStack_214 = 0x3f000000;
    uStack_210 = 0x3f000000;
    uStack_20c = 0x3f000000;
    local_578 = 0x3f0000003f000000;
    uStack_570 = 0x3f0000003f000000;
    MatteMaterial::MatteMaterial
              ((MatteMaterial *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    *(void **)this = pvVar14;
    lVar9._0_4_ = this->type;
    lVar9._4_4_ = this->illum;
    local_2e0 = pvVar14;
    local_2d8 = this;
    if (lVar9 != 0) {
      (**(code **)(**(long **)this + 0x10))();
    }
  }
  local_4d0._200_4_ = 1.4013e-45;
  std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x369bf7);
  return (int)this;
}

Assistant:

Ref<SceneGraph::MaterialNode> select() const 
    {
      std::shared_ptr<Texture> nulltex;
      if (type == NONE) {
        return new OBJMaterial(d,map_d,Ka,map_Ka,Kd,map_Kd,Ks,map_Ks,Kt,map_Kt,Ns,map_Ns,map_Displ);
      } else if (type == MATTE) {
        if (coat_eta != 1.0f) return new MetallicPaintMaterial (Kd,zero,0.0f,eta.x);
        else                  return new OBJMaterial(1.0f,nulltex,zero,nulltex,Kd,map_Kd,Ks,nulltex,zero,nulltex,1.0f/(1E-6f+roughness),nulltex,nulltex);
      } else if (type == GLASS) {
        return new ThinDielectricMaterial(Vec3fa(1.0f),eta.x,0.1f);
      } else if (type == METAL) {
        if (roughness == 0.0f) {
          if (eta == Vec3fa(1.0f) && k == Vec3fa(0.0f)) return new MirrorMaterial(Kd);
          else                                          return new MetalMaterial(Kd,eta,k);
        }
        else return new MetalMaterial(Kd,eta,k,roughness);
      } else if (type == METALLIC_PAINT) {
        return new MetallicPaintMaterial (Kd,Ks,0.0f,coat_eta);
      }
      return new MatteMaterial(Vec3fa(0.5f));
    }